

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

int __thiscall
testing::internal::UnitTestImpl::FilterTests(UnitTestImpl *this,ReactionToSharding shard_tests)

{
  TestSuite *pTVar1;
  TestInfo *pTVar2;
  bool bVar3;
  bool bVar4;
  pointer ppTVar5;
  ulong uVar6;
  int iVar7;
  byte bVar8;
  int iVar9;
  bool bVar10;
  string test_name;
  allocator local_99;
  int32_t local_98;
  int32_t local_94;
  ReactionToSharding local_90;
  int local_8c;
  string local_88;
  pointer local_68;
  pointer local_60;
  TestSuite *local_58;
  string local_50;
  
  local_94 = -1;
  local_98 = -1;
  local_90 = shard_tests;
  if (shard_tests == HONOR_SHARDING_PROTOCOL) {
    local_94 = Int32FromEnvOrDie("GTEST_TOTAL_SHARDS",-1);
    local_98 = Int32FromEnvOrDie("GTEST_SHARD_INDEX",-1);
  }
  local_60 = (this->test_suites_).
             super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>._M_impl
             .super__Vector_impl_data._M_start;
  local_68 = (this->test_suites_).
             super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>._M_impl
             .super__Vector_impl_data._M_finish;
  if (local_60 == local_68) {
    iVar7 = 0;
  }
  else {
    iVar9 = 0;
    iVar7 = 0;
    do {
      pTVar1 = *local_60;
      std::__cxx11::string::string
                ((string *)&local_50,(pTVar1->name_)._M_dataplus._M_p,(allocator *)&local_88);
      pTVar1->should_run_ = false;
      ppTVar5 = (pTVar1->test_info_list_).
                super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if ((pTVar1->test_info_list_).
          super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
          super__Vector_impl_data._M_finish != ppTVar5) {
        uVar6 = 0;
        local_58 = pTVar1;
        do {
          pTVar2 = ppTVar5[uVar6];
          std::__cxx11::string::string
                    ((string *)&local_88,(pTVar2->name_)._M_dataplus._M_p,&local_99);
          bVar3 = UnitTestOptions::MatchesFilter(&local_50,"DISABLED_*:*/DISABLED_*");
          bVar4 = true;
          if (!bVar3) {
            bVar4 = UnitTestOptions::MatchesFilter(&local_88,"DISABLED_*:*/DISABLED_*");
          }
          pTVar2->is_disabled_ = bVar4;
          bVar3 = UnitTestOptions::FilterMatchesTest(&local_50,&local_88);
          pTVar1 = local_58;
          pTVar2->matches_filter_ = bVar3;
          bVar10 = iVar9 % local_94 != local_98;
          bVar8 = bVar3 & (bVar4 ^ 1U | FLAGS_gtest_also_run_disabled_tests);
          pTVar2->is_in_another_shard_ = local_90 != IGNORE_SHARDING_PROTOCOL && bVar10;
          bVar3 = (bool)((local_90 == IGNORE_SHARDING_PROTOCOL || !bVar10) & bVar8);
          pTVar2->should_run_ = bVar3;
          local_58->should_run_ = (bool)(local_58->should_run_ | bVar3);
          local_8c = iVar7;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
          }
          iVar9 = iVar9 + (uint)bVar8;
          iVar7 = local_8c + (uint)bVar3;
          uVar6 = uVar6 + 1;
          ppTVar5 = (pTVar1->test_info_list_).
                    super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
        } while (uVar6 < (ulong)((long)(pTVar1->test_info_list_).
                                       super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar5 >>
                                3));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      local_60 = local_60 + 1;
    } while (local_60 != local_68);
  }
  return iVar7;
}

Assistant:

int UnitTestImpl::FilterTests(ReactionToSharding shard_tests) {
  const int32_t total_shards = shard_tests == HONOR_SHARDING_PROTOCOL ?
      Int32FromEnvOrDie(kTestTotalShards, -1) : -1;
  const int32_t shard_index = shard_tests == HONOR_SHARDING_PROTOCOL ?
      Int32FromEnvOrDie(kTestShardIndex, -1) : -1;

  // num_runnable_tests are the number of tests that will
  // run across all shards (i.e., match filter and are not disabled).
  // num_selected_tests are the number of tests to be run on
  // this shard.
  int num_runnable_tests = 0;
  int num_selected_tests = 0;
  for (auto* test_suite : test_suites_) {
    const std::string& test_suite_name = test_suite->name();
    test_suite->set_should_run(false);

    for (size_t j = 0; j < test_suite->test_info_list().size(); j++) {
      TestInfo* const test_info = test_suite->test_info_list()[j];
      const std::string test_name(test_info->name());
      // A test is disabled if test suite name or test name matches
      // kDisableTestFilter.
      const bool is_disabled = internal::UnitTestOptions::MatchesFilter(
                                   test_suite_name, kDisableTestFilter) ||
                               internal::UnitTestOptions::MatchesFilter(
                                   test_name, kDisableTestFilter);
      test_info->is_disabled_ = is_disabled;

      const bool matches_filter = internal::UnitTestOptions::FilterMatchesTest(
          test_suite_name, test_name);
      test_info->matches_filter_ = matches_filter;

      const bool is_runnable =
          (GTEST_FLAG(also_run_disabled_tests) || !is_disabled) &&
          matches_filter;

      const bool is_in_another_shard =
          shard_tests != IGNORE_SHARDING_PROTOCOL &&
          !ShouldRunTestOnShard(total_shards, shard_index, num_runnable_tests);
      test_info->is_in_another_shard_ = is_in_another_shard;
      const bool is_selected = is_runnable && !is_in_another_shard;

      num_runnable_tests += is_runnable;
      num_selected_tests += is_selected;

      test_info->should_run_ = is_selected;
      test_suite->set_should_run(test_suite->should_run() || is_selected);
    }
  }
  return num_selected_tests;
}